

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqualityProxyMono.cpp
# Opt level: O1

uint __thiscall Shell::EqualityProxyMono::getProxyPredicate(EqualityProxyMono *this,TermList sort)

{
  undefined1 *puVar1;
  Symbol *this_00;
  uint val;
  Entry *pEVar2;
  OperatorKey *key;
  OperatorType *type;
  Literal *pLVar3;
  Formula *pFVar4;
  undefined4 *puVar5;
  pointer pcVar6;
  Unit *this_01;
  InferenceStore *this_02;
  size_type extraout_RDX;
  TermList in_R8;
  void **head;
  void **head_2;
  void **head_1;
  initializer_list<Kernel::TermList> sorts;
  TermList local_b0;
  NonspecificInference0 local_a2;
  Literal *local_a0;
  Inference local_98;
  Inference local_68;
  
  local_b0._content = sort._content;
  pEVar2 = ::Lib::DHMap<Kernel::TermList,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::
           findEntry(&s_proxyPredicates,&local_b0);
  if (pEVar2 == (Entry *)0x0) {
    val = Kernel::Signature::addFreshPredicate(DAT_00b7e1b0,2,"sQ","eqProxy");
    this_00 = (DAT_00b7e1b0->_preds)._stack[val];
    local_68._0_8_ = local_b0._content;
    local_68._8_8_ = local_b0._content;
    sorts._M_len = extraout_RDX;
    sorts._M_array = (iterator)0x2;
    key = Kernel::OperatorType::setupKey((OperatorType *)&local_68,sorts);
    *(undefined8 *)(key + 0x18) = 2;
    type = Kernel::OperatorType::getTypeFromKey(key,0);
    Kernel::Signature::Symbol::setType(this_00,type);
    puVar1 = &this_00->field_0x40;
    *(uint *)puVar1 = *(uint *)puVar1 | 0x40040;
    ::Lib::DHMap<Kernel::TermList,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::insert
              (&s_proxyPredicates,local_b0,val);
    ::Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::insert
              (&s_proxyPredicateSorts,val,local_b0);
    pLVar3 = Kernel::Literal::create2((Literal *)(ulong)val,1,true,(TermList)0x5,in_R8);
    local_a0 = Kernel::Literal::createEquality(true,(TermList)0x1,(TermList)0x5,local_b0);
    pFVar4 = (Formula *)
             ::Lib::FixedSizeAllocator<64UL>::alloc
                       ((FixedSizeAllocator<64UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
    puVar5 = (undefined4 *)
             ::Lib::FixedSizeAllocator<48UL>::alloc
                       ((FixedSizeAllocator<48UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
    *puVar5 = 0;
    *(undefined4 **)(puVar5 + 2) = puVar5 + 6;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar5 + 2),Kernel::Formula::DEFAULT_LABEL_abi_cxx11_,
               DAT_00b7c330 + Kernel::Formula::DEFAULT_LABEL_abi_cxx11_);
    *(Literal **)(puVar5 + 10) = pLVar3;
    pcVar6 = (pointer)::Lib::FixedSizeAllocator<48UL>::alloc
                                ((FixedSizeAllocator<48UL> *)
                                 (::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
    pcVar6[0] = '\0';
    pcVar6[1] = '\0';
    pcVar6[2] = '\0';
    pcVar6[3] = '\0';
    *(pointer *)(pcVar6 + 8) = pcVar6 + 0x18;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(pcVar6 + 8),Kernel::Formula::DEFAULT_LABEL_abi_cxx11_,
               DAT_00b7c330 + Kernel::Formula::DEFAULT_LABEL_abi_cxx11_);
    *(Literal **)(pcVar6 + 0x28) = local_a0;
    pFVar4->_connective = IFF;
    (pFVar4->_label)._M_dataplus._M_p = (pointer)&(pFVar4->_label).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pFVar4->_label,Kernel::Formula::DEFAULT_LABEL_abi_cxx11_,
               DAT_00b7c330 + Kernel::Formula::DEFAULT_LABEL_abi_cxx11_);
    *(undefined4 **)(pFVar4 + 1) = puVar5;
    pFVar4[1]._label._M_dataplus._M_p = pcVar6;
    pFVar4 = Kernel::Formula::quantify(pFVar4);
    this_01 = (Unit *)::operator_new(0x48,8);
    local_a2.inputType = AXIOM;
    local_a2.rule = EQUALITY_PROXY_AXIOM1;
    Kernel::Inference::Inference(&local_98,&local_a2);
    local_68._ptr2 = local_98._ptr2;
    local_68.th_ancestors = local_98.th_ancestors;
    local_68.all_ancestors = local_98.all_ancestors;
    local_68._splits = local_98._splits;
    local_68._ptr1 = local_98._ptr1;
    local_68._0_8_ = local_98._0_8_;
    local_68._8_4_ = local_98._8_4_;
    local_68._age = local_98._age;
    Kernel::Unit::Unit(this_01,FORMULA,&local_68);
    *(Formula **)(this_01 + 1) = pFVar4;
    *(undefined8 *)&this_01[1]._inference = 3;
    Kernel::Unit::doUnitTracing(this_01);
    ::Lib::DHMap<Kernel::TermList,_Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>::insert
              (&s_proxyPremises,local_b0,this_01);
    this_02 = Kernel::InferenceStore::instance();
    Kernel::InferenceStore::recordIntroducedSymbol(this_02,this_01,PRED,val);
  }
  else {
    val = pEVar2->_val;
  }
  return val;
}

Assistant:

unsigned EqualityProxyMono::getProxyPredicate(TermList sort)
{
  unsigned pred;
  if (s_proxyPredicates.find(sort, pred)) {
    return pred;
  }

  unsigned newPred = env.signature->addFreshPredicate(2,"sQ","eqProxy");
  Signature::Symbol* predSym = env.signature->getPredicate(newPred);
  OperatorType* predType = OperatorType::getPredicateType({sort, sort});
  predSym->setType(predType);
  predSym->markEqualityProxy();
  // don't need congruence axioms for the equality predicate itself
  predSym->markSkipCongruence();

  ASS(sort.isTerm());
  ASS(sort.term()->shared());
  ASS(sort.term()->ground());

  ALWAYS(s_proxyPredicates.insert(sort,newPred));
  s_proxyPredicateSorts.insert(newPred,sort);

  Literal* proxyLit = Literal::create2(newPred,true,TermList(0,false),TermList(1,false));
  Literal* eqLit = Literal::createEquality(true,TermList(0,false),TermList(1,false),sort);
  Formula* defForm = new BinaryFormula(IFF, new AtomicFormula(proxyLit), new AtomicFormula(eqLit));
  Formula* quantDefForm = Formula::quantify(defForm);

  FormulaUnit* defUnit = new FormulaUnit(quantDefForm,NonspecificInference0(UnitInputType::AXIOM,InferenceRule::EQUALITY_PROXY_AXIOM1));

  s_proxyPremises.insert(sort, defUnit);
  InferenceStore::instance()->recordIntroducedSymbol(defUnit, SymbolType::PRED, newPred);
  return newPred;
}